

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition.hxx
# Opt level: O0

void __thiscall andres::Partition<unsigned_long>::assign(Partition<unsigned_long> *this,Index size)

{
  reference pvVar1;
  pointer in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  Index j;
  pointer local_18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__new_size;
  
  __new_size = in_RDI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (unaff_retaddr,(size_type)in_RDI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (unaff_retaddr,(size_type)__new_size);
  in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = in_RSI;
  for (local_18 = (pointer)0x0; local_18 < in_RSI; local_18 = (pointer)((long)local_18 + 1)) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RDI,(size_type)local_18);
    *pvVar1 = (value_type)local_18;
  }
  return;
}

Assistant:

inline void
Partition<T>::assign(
    const Index size
) {
    parents_.resize(static_cast<std::size_t>(size));
    ranks_.resize(static_cast<std::size_t>(size));
    numberOfSets_ = size;
    for(Index j = 0; j < size; ++j) {
        parents_[static_cast<std::size_t>(j)] = j;
    }
}